

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

shared_ptr<Access> __thiscall Parser::offset(Parser *this,shared_ptr<Id> *a)

{
  shared_ptr<Expr> *__args_1;
  shared_ptr<Expr> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Access> sVar1;
  undefined1 local_c8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  shared_ptr<Expr> i;
  shared_ptr<Type> type;
  shared_ptr<Expr> w;
  shared_ptr<Expr> loc;
  shared_ptr<Expr> t1;
  shared_ptr<Expr> t2;
  
  i.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  i.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  w.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  w.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  t1.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  t1.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  t2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  t2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  loc.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  loc.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>,
             &(((in_RDX->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type).
              super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>);
  match((Parser *)a,0x5b);
  boolean((Parser *)local_c8);
  std::__shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&i.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
  match((Parser *)a,0x5d);
  std::dynamic_pointer_cast<Array,Type>((shared_ptr<Type> *)local_c8);
  std::__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2> *)
             &(((shared_ptr<Type> *)(local_c8._0_8_ + 0x30))->
              super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
  std::make_shared<Constant,int&>((int *)local_c8);
  std::__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2> *)&w,
             (__shared_ptr<Constant,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
  std::make_shared<Token,char>(local_c8 + 0x10);
  std::make_shared<Arith,std::shared_ptr<Token>,std::shared_ptr<Expr>&,std::shared_ptr<Expr>&>
            ((shared_ptr<Token> *)local_c8,(shared_ptr<Expr> *)(local_c8 + 0x10),&i);
  std::__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2> *)
             &t1.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Arith,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
  std::__shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&loc.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>,
             &t1.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>);
  __args_1 = (shared_ptr<Expr> *)(local_c8 + 0x10);
  while ((a[2].super___shared_ptr<Id,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
         == 0x5b) {
    match((Parser *)a,0x5b);
    boolean((Parser *)local_c8);
    std::__shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&i.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
    match((Parser *)a,0x5d);
    std::dynamic_pointer_cast<Array,Type>((shared_ptr<Type> *)local_c8);
    std::__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2> *)
               &(((shared_ptr<Type> *)(local_c8._0_8_ + 0x30))->
                super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
    std::make_shared<Constant,int&>((int *)local_c8);
    std::__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2> *)&w,
               (__shared_ptr<Constant,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
    std::make_shared<Token,char>((char *)__args_1);
    std::make_shared<Arith,std::shared_ptr<Token>,std::shared_ptr<Expr>&,std::shared_ptr<Expr>&>
              ((shared_ptr<Token> *)local_c8,__args_1,&i);
    std::__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2> *)&t1,
               (__shared_ptr<Arith,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
    std::make_shared<Token,char>((char *)__args_1);
    std::make_shared<Arith,std::shared_ptr<Token>,std::shared_ptr<Expr>&,std::shared_ptr<Expr>&>
              ((shared_ptr<Token> *)local_c8,__args_1,
               (shared_ptr<Expr> *)&loc.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2> *)
               &t2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Arith,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
    std::__shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&loc.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>,
               &t2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>);
  }
  std::make_shared<Access,std::shared_ptr<Id>&,std::shared_ptr<Expr>&,std::shared_ptr<Type>&>
            ((shared_ptr<Id> *)this,in_RDX,(shared_ptr<Type> *)&loc);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&loc.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t2.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t1.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&w.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&i.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar1.super___shared_ptr<Access,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Access,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Access>)sVar1.super___shared_ptr<Access,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Access> offset(std::shared_ptr<Id> a) {
		std::shared_ptr<Expr> i, w, t1, t2, loc;
		std::shared_ptr<Type> type = a->type;
		match('['); i = boolean(); match(']');
		type = (std::dynamic_pointer_cast<Array>(type))->of;
		w = std::make_shared<Constant>(type->width);
		t1 = std::make_shared<Arith>(std::make_shared<Token>('*'), i, w);
		loc = t1;
		while (look->tag == '[') {
			match('['); i = boolean(); match(']');
			type = (std::dynamic_pointer_cast<Array>(type))->of;
			w = std::make_shared<Constant>(type->width);
			t1 = std::make_shared<Arith>(std::make_shared<Token>('*'), i, w);
			t2 = std::make_shared<Arith>(std::make_shared<Token>('+'), loc, t1);
			loc = t2;
		}
		return std::make_shared<Access>(a, loc, type);
	}